

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void array_container_xor(array_container_t *array_1,array_container_t *array_2,
                        array_container_t *out)

{
  _Bool _Var1;
  int min;
  uint32_t uVar2;
  int32_t iVar3;
  int32_t max_cardinality;
  int32_t card_2;
  int32_t card_1;
  array_container_t *out_local;
  array_container_t *array_2_local;
  array_container_t *array_1_local;
  
  min = array_1->cardinality + array_2->cardinality;
  if (out->capacity < min) {
    array_container_grow(out,min,false);
  }
  _Var1 = croaring_avx2();
  if (_Var1) {
    uVar2 = xor_vector16(array_1->array,array_1->cardinality,array_2->array,array_2->cardinality,
                         out->array);
    out->cardinality = uVar2;
  }
  else {
    iVar3 = xor_uint16(array_1->array,array_1->cardinality,array_2->array,array_2->cardinality,
                       out->array);
    out->cardinality = iVar3;
  }
  return;
}

Assistant:

void array_container_xor(const array_container_t *array_1,
                         const array_container_t *array_2,
                         array_container_t *out) {
    const int32_t card_1 = array_1->cardinality, card_2 = array_2->cardinality;
    const int32_t max_cardinality = card_1 + card_2;
    if (out->capacity < max_cardinality) {
        array_container_grow(out, max_cardinality, false);
    }

#ifdef CROARING_IS_X64
    if( croaring_avx2() ) {
      out->cardinality =
        xor_vector16(array_1->array, array_1->cardinality, array_2->array,
                     array_2->cardinality, out->array);
    } else {
      out->cardinality =
        xor_uint16(array_1->array, array_1->cardinality, array_2->array,
                   array_2->cardinality, out->array);
    }
#else
    out->cardinality =
        xor_uint16(array_1->array, array_1->cardinality, array_2->array,
                   array_2->cardinality, out->array);
#endif
}